

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

_Bool Hacl_Impl_P256_DH_ecp256dh_r
                (uint8_t *shared_secret,uint8_t *their_pubkey,uint8_t *private_key)

{
  _Bool _Var1;
  _Bool local_1b9;
  uint64_t local_1b8;
  uint64_t ss_proj [12];
  uint64_t is_sk_valid;
  uint64_t x_3;
  uint64_t uu____0_3;
  uint64_t *os_3;
  uint64_t x_2;
  uint64_t uu____0_2;
  uint64_t *os_2;
  uint64_t x_1;
  uint64_t uu____0_1;
  uint64_t *os_1;
  uint64_t x;
  uint64_t uu____0;
  uint64_t *os;
  undefined8 uStack_e8;
  uint32_t i;
  uint64_t oneq [4];
  uint64_t is_b_valid;
  _Bool is_pk_valid;
  uint64_t *pk;
  uint64_t *sk;
  uint64_t tmp [16];
  uint8_t *private_key_local;
  uint8_t *their_pubkey_local;
  uint8_t *shared_secret_local;
  
  memset(&sk,0,0x80);
  _Var1 = load_point_vartime(tmp + 3,their_pubkey);
  bn_from_bytes_be4((uint64_t *)&sk,private_key);
  oneq[3] = bn_is_lt_order_and_gt_zero_mask4((uint64_t *)&sk);
  memset(&stack0xffffffffffffff18,0,0x20);
  uStack_e8 = 1;
  oneq[0] = 0;
  oneq[1] = 0;
  oneq[2] = 0;
  sk = (uint64_t *)(oneq[3] & ((ulong)sk ^ 1) ^ 1);
  tmp[0] = oneq[3] & tmp[0];
  tmp[1] = oneq[3] & tmp[1];
  tmp[2] = oneq[3] & tmp[2];
  ss_proj[0xb] = oneq[3];
  memset(&local_1b8,0,0x60);
  if (_Var1) {
    point_mul(&local_1b8,(uint64_t *)&sk,tmp + 3);
    point_store(shared_secret,&local_1b8);
  }
  local_1b9 = false;
  if (ss_proj[0xb] == 0xffffffffffffffff) {
    local_1b9 = _Var1;
  }
  return local_1b9;
}

Assistant:

bool
Hacl_Impl_P256_DH_ecp256dh_r(
  uint8_t *shared_secret,
  uint8_t *their_pubkey,
  uint8_t *private_key
)
{
  uint64_t tmp[16U] = { 0U };
  uint64_t *sk = tmp;
  uint64_t *pk = tmp + 4U;
  bool is_pk_valid = load_point_vartime(pk, their_pubkey);
  bn_from_bytes_be4(sk, private_key);
  uint64_t is_b_valid = bn_is_lt_order_and_gt_zero_mask4(sk);
  uint64_t oneq[4U] = { 0U };
  oneq[0U] = 1ULL;
  oneq[1U] = 0ULL;
  oneq[2U] = 0ULL;
  oneq[3U] = 0ULL;
  KRML_MAYBE_FOR4(i,
    0U,
    4U,
    1U,
    uint64_t *os = sk;
    uint64_t uu____0 = oneq[i];
    uint64_t x = uu____0 ^ (is_b_valid & (sk[i] ^ uu____0));
    os[i] = x;);
  uint64_t is_sk_valid = is_b_valid;
  uint64_t ss_proj[12U] = { 0U };
  if (is_pk_valid)
  {
    point_mul(ss_proj, sk, pk);
    point_store(shared_secret, ss_proj);
  }
  return is_sk_valid == 0xFFFFFFFFFFFFFFFFULL && is_pk_valid;
}